

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16to8.h
# Opt level: O2

void ncnn::im2col_sgemm_pack16to8_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  int *piVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [64];
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [64];
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  undefined1 (*pauVar31) [32];
  undefined1 (*pauVar32) [64];
  int iVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [64];
  undefined1 (*pauVar36) [32];
  long lVar37;
  undefined1 (*pauVar38) [32];
  int q;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  ulong uVar39;
  long lVar40;
  bool bVar41;
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  float afVar62 [16];
  Mat local_e8;
  ulong local_a0;
  ulong local_98;
  uint local_8c;
  void *local_88;
  Mat *local_80;
  float zeros [16];
  
  uVar3 = bottom_im2col->w;
  lVar40 = (long)(int)uVar3;
  iVar20 = bottom_im2col->h;
  uVar24 = bottom_im2col->c;
  local_98 = (ulong)top_blob->c;
  local_88 = _bias->data;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  if (lVar40 < 8) {
    iVar28 = iVar20;
    uVar23 = uVar3;
    if (3 < (int)uVar3) {
      iVar28 = iVar20 * 4;
      uVar23 = (uVar3 & 3) + 1;
    }
  }
  else {
    iVar28 = iVar20 * 8;
    uVar23 = (uVar3 & 3) + (uVar3 >> 3) + (uint)((uVar3 >> 2 & 1) != 0);
  }
  local_80 = top_blob;
  Mat::create(&local_e8,iVar28,uVar24,uVar23,0x40,0x10,opt->workspace_allocator);
  iVar19 = (int)((long)(int)uVar3 / 8);
  uVar21 = 0;
  iVar28 = 0;
  if (0 < iVar20) {
    iVar28 = iVar20;
  }
  uVar34 = 0;
  if (0 < (int)uVar24) {
    uVar34 = (ulong)uVar24;
  }
  uVar25 = 0;
  if (0 < iVar19) {
    uVar25 = (long)(int)uVar3 / 8 & 0xffffffff;
  }
  lVar37 = (long)(int)(uVar3 << 4) * 4;
  lVar29 = 0x100;
  for (; uVar21 != uVar25; uVar21 = uVar21 + 1) {
    pauVar32 = (undefined1 (*) [64])
               (local_e8.cstep * uVar21 *
                CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
               (long)local_e8.data);
    for (uVar39 = 0; uVar39 != uVar34; uVar39 = uVar39 + 1) {
      pauVar26 = (undefined1 (*) [64])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar39 + lVar29);
      iVar33 = iVar28;
      while (bVar41 = iVar33 != 0, iVar33 = iVar33 + -1, bVar41) {
        auVar50 = vunpcklps_avx512f(pauVar26[-4],pauVar26[-3]);
        auVar51 = vunpckhps_avx512f(pauVar26[-4],pauVar26[-3]);
        auVar52 = vunpcklps_avx512f(pauVar26[-2],pauVar26[-1]);
        auVar53 = vunpckhps_avx512f(pauVar26[-2],pauVar26[-1]);
        auVar54 = vunpcklps_avx512f(*pauVar26,pauVar26[1]);
        auVar55 = vunpckhps_avx512f(*pauVar26,pauVar26[1]);
        auVar56 = vunpcklps_avx512f(pauVar26[2],pauVar26[3]);
        auVar57 = vunpckhps_avx512f(pauVar26[2],pauVar26[3]);
        auVar58 = vunpcklpd_avx512f(auVar50,auVar52);
        auVar50 = vunpckhpd_avx512f(auVar50,auVar52);
        auVar52 = vunpcklpd_avx512f(auVar51,auVar53);
        auVar51 = vunpckhpd_avx512f(auVar51,auVar53);
        auVar53 = vunpcklpd_avx512f(auVar54,auVar56);
        auVar54 = vunpckhpd_avx512f(auVar54,auVar56);
        auVar56 = vunpcklpd_avx512f(auVar55,auVar57);
        auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
        auVar57 = vshuff64x2_avx512f(auVar58,auVar53,0x88);
        auVar59 = vshuff64x2_avx512f(auVar50,auVar54,0x88);
        auVar60 = vshuff64x2_avx512f(auVar52,auVar56,0x88);
        auVar61 = vshuff64x2_avx512f(auVar51,auVar55,0x88);
        auVar53 = vshuff64x2_avx512f(auVar58,auVar53,0xdd);
        auVar50 = vshuff64x2_avx512f(auVar50,auVar54,0xdd);
        auVar52 = vshuff64x2_avx512f(auVar52,auVar56,0xdd);
        auVar51 = vshuff64x2_avx512f(auVar51,auVar55,0xdd);
        auVar54 = vshuff64x2_avx512f(auVar57,auVar59,0x88);
        auVar55 = vshuff64x2_avx512f(auVar60,auVar61,0x88);
        auVar56 = vshuff64x2_avx512f(auVar53,auVar50,0x88);
        auVar58 = vshuff64x2_avx512f(auVar52,auVar51,0x88);
        auVar57 = vshuff64x2_avx512f(auVar57,auVar59,0xdd);
        auVar59 = vshuff64x2_avx512f(auVar60,auVar61,0xdd);
        auVar50 = vshuff64x2_avx512f(auVar53,auVar50,0xdd);
        auVar51 = vshuff64x2_avx512f(auVar52,auVar51,0xdd);
        *pauVar32 = auVar54;
        pauVar32[1] = auVar55;
        pauVar32[2] = auVar56;
        pauVar32[3] = auVar58;
        pauVar32[4] = auVar57;
        pauVar32[5] = auVar59;
        pauVar32[6] = auVar50;
        pauVar32[7] = auVar51;
        pauVar32 = pauVar32 + 8;
        pauVar26 = (undefined1 (*) [64])(*pauVar26 + lVar37);
      }
    }
    lVar29 = lVar29 + 0x200;
  }
  iVar33 = iVar19 * 8;
  local_8c = uVar3 + iVar19 * -8;
  uVar25 = 0;
  uVar21 = (ulong)(uint)((int)local_8c >> 2);
  if ((int)local_8c >> 2 < 1) {
    uVar21 = uVar25;
  }
  lVar29 = ((long)iVar33 | 2U) << 6;
  for (; uVar25 != uVar21; uVar25 = uVar25 + 1) {
    iVar19 = iVar33 + (int)uVar25 * 4;
    pauVar32 = (undefined1 (*) [64])
               ((long)((iVar19 % 8 >> 2) + iVar19 / 8) * local_e8.cstep *
                CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
               (long)local_e8.data);
    for (uVar39 = 0; uVar39 != uVar34; uVar39 = uVar39 + 1) {
      pauVar26 = (undefined1 (*) [64])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar39 + lVar29);
      iVar19 = iVar28;
      while (bVar41 = iVar19 != 0, iVar19 = iVar19 + -1, bVar41) {
        auVar50 = vunpcklps_avx512f(pauVar26[-2],pauVar26[-1]);
        auVar51 = vunpckhps_avx512f(pauVar26[-2],pauVar26[-1]);
        auVar52 = vunpcklps_avx512f(*pauVar26,pauVar26[1]);
        auVar53 = vunpckhps_avx512f(*pauVar26,pauVar26[1]);
        auVar54 = vunpcklpd_avx512f(auVar50,auVar52);
        auVar50 = vunpckhpd_avx512f(auVar50,auVar52);
        auVar52 = vunpcklpd_avx512f(auVar51,auVar53);
        auVar51 = vunpckhpd_avx512f(auVar51,auVar53);
        auVar53 = vshuff64x2_avx512f(auVar54,auVar50,0x88);
        auVar55 = vshuff64x2_avx512f(auVar52,auVar51,0x88);
        auVar50 = vshuff64x2_avx512f(auVar54,auVar50,0xdd);
        auVar51 = vshuff64x2_avx512f(auVar52,auVar51,0xdd);
        auVar52 = vshuff64x2_avx512f(auVar53,auVar55,0x88);
        auVar54 = vshuff64x2_avx512f(auVar50,auVar51,0x88);
        auVar53 = vshuff64x2_avx512f(auVar53,auVar55,0xdd);
        auVar50 = vshuff64x2_avx512f(auVar50,auVar51,0xdd);
        *pauVar32 = auVar52;
        pauVar32[1] = auVar54;
        pauVar32[2] = auVar53;
        pauVar32[3] = auVar50;
        pauVar32 = pauVar32 + 4;
        pauVar26 = (undefined1 (*) [64])(*pauVar26 + lVar37);
      }
    }
    lVar29 = lVar29 + 0x100;
  }
  uVar21 = (ulong)(int)((local_8c & 0xfffffffc) + iVar33);
  lVar29 = uVar21 << 6;
  for (; (long)uVar21 < lVar40; uVar21 = uVar21 + 1) {
    uVar23 = (int)uVar21 >> 0x1f;
    uVar25 = (ulong)uVar23 << 0x20 | uVar21 & 0xffffffff;
    pauVar32 = (undefined1 (*) [64])
               ((long)((int)((long)((ulong)uVar23 << 0x20 | uVar21 & 0xffffffff) % 4) +
                       (int)((long)uVar25 / 8) + (int)(char)((char)((long)uVar25 % 8) / '\x04')) *
                local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
               (long)local_e8.data);
    for (uVar25 = 0; uVar25 != uVar34; uVar25 = uVar25 + 1) {
      pauVar26 = (undefined1 (*) [64])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + lVar29);
      iVar19 = iVar28;
      while (bVar41 = iVar19 != 0, iVar19 = iVar19 + -1, bVar41) {
        *pauVar32 = *pauVar26;
        pauVar32 = pauVar32 + 1;
        pauVar26 = (undefined1 (*) [64])(*pauVar26 + lVar37);
      }
    }
    lVar29 = lVar29 + 0x40;
  }
  uVar23 = (int)local_98 >> 1;
  uVar34 = 0;
  uVar21 = (ulong)(uVar24 * iVar20 * 0x10);
  if ((int)(uVar24 * iVar20 * 0x10) < 1) {
    uVar21 = uVar34;
  }
  local_a0 = (ulong)uVar23;
  if ((int)uVar23 < 1) {
    local_a0 = uVar34;
  }
  afVar62 = (float  [16])(ZEXT864(0) << 0x40);
  for (; uVar34 != local_a0; uVar34 = uVar34 + 1) {
    pauVar26 = (undefined1 (*) [64])
               (uVar34 * 2 * local_80->cstep * local_80->elemsize + (long)local_80->data);
    pauVar35 = (undefined1 (*) [64])
               ((uVar34 * 2 + 1) * local_80->cstep * local_80->elemsize + (long)local_80->data);
    zeros[0] = afVar62[0];
    zeros[1] = afVar62[1];
    zeros[2] = afVar62[2];
    zeros[3] = afVar62[3];
    zeros[4] = afVar62[4];
    zeros[5] = afVar62[5];
    zeros[6] = afVar62[6];
    zeros[7] = afVar62[7];
    zeros[8] = afVar62[8];
    zeros[9] = afVar62[9];
    zeros[10] = afVar62[10];
    zeros[0xb] = afVar62[0xb];
    zeros[0xc] = afVar62[0xc];
    zeros[0xd] = afVar62[0xd];
    zeros[0xe] = afVar62[0xe];
    zeros[0xf] = afVar62[0xf];
    pauVar32 = (undefined1 (*) [64])(uVar34 * 0x40 + (long)local_88);
    if (local_88 == (void *)0x0) {
      pauVar32 = (undefined1 (*) [64])zeros;
    }
    lVar29 = 0;
    for (uVar25 = 0; (long)(uVar25 | 7) < lVar40; uVar25 = uVar25 + 8) {
      auVar50 = *pauVar32;
      lVar27 = local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
               lVar29;
      lVar37 = 0;
      uVar39 = uVar21;
      auVar51 = auVar50;
      auVar52 = auVar50;
      auVar53 = auVar50;
      auVar54 = auVar50;
      auVar55 = auVar50;
      auVar56 = auVar50;
      auVar57 = auVar50;
      while (iVar20 = (int)uVar39, uVar39 = (ulong)(iVar20 - 1), iVar20 != 0) {
        auVar58 = *(undefined1 (*) [64])
                   ((long)kernel->data + lVar37 * 2 + kernel->cstep * uVar34 * kernel->elemsize);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar27);
        auVar59._4_4_ = uVar1;
        auVar59._0_4_ = uVar1;
        auVar59._8_4_ = uVar1;
        auVar59._12_4_ = uVar1;
        auVar59._16_4_ = uVar1;
        auVar59._20_4_ = uVar1;
        auVar59._24_4_ = uVar1;
        auVar59._28_4_ = uVar1;
        auVar59._32_4_ = uVar1;
        auVar59._36_4_ = uVar1;
        auVar59._40_4_ = uVar1;
        auVar59._44_4_ = uVar1;
        auVar59._48_4_ = uVar1;
        auVar59._52_4_ = uVar1;
        auVar59._56_4_ = uVar1;
        auVar59._60_4_ = uVar1;
        auVar57 = vfmadd231ps_avx512f(auVar57,auVar58,auVar59);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar27 + 4);
        auVar60._4_4_ = uVar1;
        auVar60._0_4_ = uVar1;
        auVar60._8_4_ = uVar1;
        auVar60._12_4_ = uVar1;
        auVar60._16_4_ = uVar1;
        auVar60._20_4_ = uVar1;
        auVar60._24_4_ = uVar1;
        auVar60._28_4_ = uVar1;
        auVar60._32_4_ = uVar1;
        auVar60._36_4_ = uVar1;
        auVar60._40_4_ = uVar1;
        auVar60._44_4_ = uVar1;
        auVar60._48_4_ = uVar1;
        auVar60._52_4_ = uVar1;
        auVar60._56_4_ = uVar1;
        auVar60._60_4_ = uVar1;
        auVar56 = vfmadd231ps_avx512f(auVar56,auVar58,auVar60);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar27 + 8);
        auVar61._4_4_ = uVar1;
        auVar61._0_4_ = uVar1;
        auVar61._8_4_ = uVar1;
        auVar61._12_4_ = uVar1;
        auVar61._16_4_ = uVar1;
        auVar61._20_4_ = uVar1;
        auVar61._24_4_ = uVar1;
        auVar61._28_4_ = uVar1;
        auVar61._32_4_ = uVar1;
        auVar61._36_4_ = uVar1;
        auVar61._40_4_ = uVar1;
        auVar61._44_4_ = uVar1;
        auVar61._48_4_ = uVar1;
        auVar61._52_4_ = uVar1;
        auVar61._56_4_ = uVar1;
        auVar61._60_4_ = uVar1;
        auVar55 = vfmadd231ps_avx512f(auVar55,auVar58,auVar61);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar27 + 0xc);
        auVar13._4_4_ = uVar1;
        auVar13._0_4_ = uVar1;
        auVar13._8_4_ = uVar1;
        auVar13._12_4_ = uVar1;
        auVar13._16_4_ = uVar1;
        auVar13._20_4_ = uVar1;
        auVar13._24_4_ = uVar1;
        auVar13._28_4_ = uVar1;
        auVar13._32_4_ = uVar1;
        auVar13._36_4_ = uVar1;
        auVar13._40_4_ = uVar1;
        auVar13._44_4_ = uVar1;
        auVar13._48_4_ = uVar1;
        auVar13._52_4_ = uVar1;
        auVar13._56_4_ = uVar1;
        auVar13._60_4_ = uVar1;
        auVar54 = vfmadd231ps_avx512f(auVar54,auVar58,auVar13);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar27 + 0x10);
        auVar14._4_4_ = uVar1;
        auVar14._0_4_ = uVar1;
        auVar14._8_4_ = uVar1;
        auVar14._12_4_ = uVar1;
        auVar14._16_4_ = uVar1;
        auVar14._20_4_ = uVar1;
        auVar14._24_4_ = uVar1;
        auVar14._28_4_ = uVar1;
        auVar14._32_4_ = uVar1;
        auVar14._36_4_ = uVar1;
        auVar14._40_4_ = uVar1;
        auVar14._44_4_ = uVar1;
        auVar14._48_4_ = uVar1;
        auVar14._52_4_ = uVar1;
        auVar14._56_4_ = uVar1;
        auVar14._60_4_ = uVar1;
        auVar53 = vfmadd231ps_avx512f(auVar53,auVar58,auVar14);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar27 + 0x14);
        auVar15._4_4_ = uVar1;
        auVar15._0_4_ = uVar1;
        auVar15._8_4_ = uVar1;
        auVar15._12_4_ = uVar1;
        auVar15._16_4_ = uVar1;
        auVar15._20_4_ = uVar1;
        auVar15._24_4_ = uVar1;
        auVar15._28_4_ = uVar1;
        auVar15._32_4_ = uVar1;
        auVar15._36_4_ = uVar1;
        auVar15._40_4_ = uVar1;
        auVar15._44_4_ = uVar1;
        auVar15._48_4_ = uVar1;
        auVar15._52_4_ = uVar1;
        auVar15._56_4_ = uVar1;
        auVar15._60_4_ = uVar1;
        auVar52 = vfmadd231ps_avx512f(auVar52,auVar58,auVar15);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar27 + 0x18);
        auVar16._4_4_ = uVar1;
        auVar16._0_4_ = uVar1;
        auVar16._8_4_ = uVar1;
        auVar16._12_4_ = uVar1;
        auVar16._16_4_ = uVar1;
        auVar16._20_4_ = uVar1;
        auVar16._24_4_ = uVar1;
        auVar16._28_4_ = uVar1;
        auVar16._32_4_ = uVar1;
        auVar16._36_4_ = uVar1;
        auVar16._40_4_ = uVar1;
        auVar16._44_4_ = uVar1;
        auVar16._48_4_ = uVar1;
        auVar16._52_4_ = uVar1;
        auVar16._56_4_ = uVar1;
        auVar16._60_4_ = uVar1;
        auVar51 = vfmadd231ps_avx512f(auVar51,auVar58,auVar16);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar27 + 0x1c);
        auVar17._4_4_ = uVar1;
        auVar17._0_4_ = uVar1;
        auVar17._8_4_ = uVar1;
        auVar17._12_4_ = uVar1;
        auVar17._16_4_ = uVar1;
        auVar17._20_4_ = uVar1;
        auVar17._24_4_ = uVar1;
        auVar17._28_4_ = uVar1;
        auVar17._32_4_ = uVar1;
        auVar17._36_4_ = uVar1;
        auVar17._40_4_ = uVar1;
        auVar17._44_4_ = uVar1;
        auVar17._48_4_ = uVar1;
        auVar17._52_4_ = uVar1;
        auVar17._56_4_ = uVar1;
        auVar17._60_4_ = uVar1;
        auVar50 = vfmadd231ps_avx512f(auVar50,auVar58,auVar17);
        lVar37 = lVar37 + 0x20;
      }
      auVar58 = vinsertf64x4_avx512f(auVar57,auVar56._0_32_,1);
      *pauVar26 = auVar58;
      auVar58 = vinsertf64x4_avx512f(auVar55,auVar54._0_32_,1);
      pauVar26[1] = auVar58;
      auVar58 = vinsertf64x4_avx512f(auVar53,auVar52._0_32_,1);
      pauVar26[2] = auVar58;
      auVar58 = vinsertf64x4_avx512f(auVar51,auVar50._0_32_,1);
      pauVar26[3] = auVar58;
      auVar56 = vshuff64x2_avx512f(auVar57,auVar56,0xee);
      *pauVar35 = auVar56;
      auVar54 = vshuff64x2_avx512f(auVar55,auVar54,0xee);
      pauVar35[1] = auVar54;
      auVar52 = vshuff64x2_avx512f(auVar53,auVar52,0xee);
      pauVar35[2] = auVar52;
      auVar50 = vshuff64x2_avx512f(auVar51,auVar50,0xee);
      pauVar35[3] = auVar50;
      pauVar26 = pauVar26 + 4;
      pauVar35 = pauVar35 + 4;
      lVar29 = lVar29 + 1;
    }
    uVar24 = 0;
    for (; (int)((uint)uVar25 | 3) < (int)uVar3; uVar25 = (ulong)((uint)uVar25 + 4)) {
      lVar29 = local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
               (ulong)((uVar24 & 1) + ((uint)(uVar25 >> 3) & 0x1fffffff));
      auVar50 = *pauVar32;
      lVar37 = 0;
      uVar39 = uVar21;
      auVar51 = auVar50;
      auVar52 = auVar50;
      auVar53 = auVar50;
      while (iVar20 = (int)uVar39, uVar39 = (ulong)(iVar20 - 1), iVar20 != 0) {
        auVar54 = *(undefined1 (*) [64])
                   ((long)kernel->data + lVar37 * 4 + kernel->cstep * uVar34 * kernel->elemsize);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar29);
        auVar55._4_4_ = uVar1;
        auVar55._0_4_ = uVar1;
        auVar55._8_4_ = uVar1;
        auVar55._12_4_ = uVar1;
        auVar55._16_4_ = uVar1;
        auVar55._20_4_ = uVar1;
        auVar55._24_4_ = uVar1;
        auVar55._28_4_ = uVar1;
        auVar55._32_4_ = uVar1;
        auVar55._36_4_ = uVar1;
        auVar55._40_4_ = uVar1;
        auVar55._44_4_ = uVar1;
        auVar55._48_4_ = uVar1;
        auVar55._52_4_ = uVar1;
        auVar55._56_4_ = uVar1;
        auVar55._60_4_ = uVar1;
        auVar50 = vfmadd231ps_avx512f(auVar50,auVar54,auVar55);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar29 + 4);
        auVar56._4_4_ = uVar1;
        auVar56._0_4_ = uVar1;
        auVar56._8_4_ = uVar1;
        auVar56._12_4_ = uVar1;
        auVar56._16_4_ = uVar1;
        auVar56._20_4_ = uVar1;
        auVar56._24_4_ = uVar1;
        auVar56._28_4_ = uVar1;
        auVar56._32_4_ = uVar1;
        auVar56._36_4_ = uVar1;
        auVar56._40_4_ = uVar1;
        auVar56._44_4_ = uVar1;
        auVar56._48_4_ = uVar1;
        auVar56._52_4_ = uVar1;
        auVar56._56_4_ = uVar1;
        auVar56._60_4_ = uVar1;
        auVar52 = vfmadd231ps_avx512f(auVar52,auVar54,auVar56);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar29 + 8);
        auVar57._4_4_ = uVar1;
        auVar57._0_4_ = uVar1;
        auVar57._8_4_ = uVar1;
        auVar57._12_4_ = uVar1;
        auVar57._16_4_ = uVar1;
        auVar57._20_4_ = uVar1;
        auVar57._24_4_ = uVar1;
        auVar57._28_4_ = uVar1;
        auVar57._32_4_ = uVar1;
        auVar57._36_4_ = uVar1;
        auVar57._40_4_ = uVar1;
        auVar57._44_4_ = uVar1;
        auVar57._48_4_ = uVar1;
        auVar57._52_4_ = uVar1;
        auVar57._56_4_ = uVar1;
        auVar57._60_4_ = uVar1;
        auVar51 = vfmadd231ps_avx512f(auVar51,auVar54,auVar57);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar37 + lVar29 + 0xc);
        auVar58._4_4_ = uVar1;
        auVar58._0_4_ = uVar1;
        auVar58._8_4_ = uVar1;
        auVar58._12_4_ = uVar1;
        auVar58._16_4_ = uVar1;
        auVar58._20_4_ = uVar1;
        auVar58._24_4_ = uVar1;
        auVar58._28_4_ = uVar1;
        auVar58._32_4_ = uVar1;
        auVar58._36_4_ = uVar1;
        auVar58._40_4_ = uVar1;
        auVar58._44_4_ = uVar1;
        auVar58._48_4_ = uVar1;
        auVar58._52_4_ = uVar1;
        auVar58._56_4_ = uVar1;
        auVar58._60_4_ = uVar1;
        auVar53 = vfmadd231ps_avx512f(auVar53,auVar54,auVar58);
        lVar37 = lVar37 + 0x10;
      }
      auVar54 = vinsertf64x4_avx512f(auVar50,auVar52._0_32_,1);
      *pauVar26 = auVar54;
      auVar54 = vinsertf64x4_avx512f(auVar51,auVar53._0_32_,1);
      pauVar26[1] = auVar54;
      auVar50 = vshuff64x2_avx512f(auVar50,auVar52,0xee);
      *pauVar35 = auVar50;
      auVar50 = vshuff64x2_avx512f(auVar51,auVar53,0xee);
      pauVar35[1] = auVar50;
      pauVar26 = pauVar26 + 2;
      pauVar35 = pauVar35 + 2;
      uVar24 = (uint)(byte)((char)uVar24 + 1);
    }
    while( true ) {
      uVar24 = (uint)uVar25;
      if ((int)uVar3 <= (int)uVar24) break;
      pauVar22 = (undefined1 (*) [64])
                 (kernel->cstep * uVar34 * kernel->elemsize + (long)kernel->data);
      auVar50 = *pauVar32;
      for (lVar29 = 0; (int)uVar21 != (int)lVar29; lVar29 = lVar29 + 1) {
        auVar51 = vbroadcastss_avx512f
                            (ZEXT416(*(uint *)((long)local_e8.data +
                                              lVar29 * 4 +
                                              local_e8.cstep *
                                              CONCAT44(local_e8.elemsize._4_4_,
                                                       (undefined4)local_e8.elemsize) *
                                              (ulong)((uVar24 & 3) +
                                                      ((uint)(uVar25 >> 3) & 0x1fffffff) +
                                                     (uint)((uVar24 >> 2 & 1) != 0)))));
        auVar50 = vfmadd231ps_avx512f(auVar50,auVar51,*pauVar22);
        pauVar22 = pauVar22 + 1;
      }
      *(undefined1 (*) [32])*pauVar26 = auVar50._0_32_;
      auVar42 = vextractf64x4_avx512f(auVar50,1);
      *(undefined1 (*) [32])*pauVar35 = auVar42;
      pauVar26 = (undefined1 (*) [64])((long)*pauVar26 + 0x20);
      pauVar35 = (undefined1 (*) [64])((long)*pauVar35 + 0x20);
      uVar25 = (ulong)(uVar24 + 1);
    }
  }
  for (uVar34 = local_98 & 0xfffffffffffffffe; afVar62 = zeros, (long)uVar34 < (long)local_98;
      uVar34 = uVar34 + 1) {
    pauVar36 = (undefined1 (*) [32])
               (local_80->cstep * uVar34 * local_80->elemsize + (long)local_80->data);
    zeros._32_32_ = afVar62._32_32_;
    zeros._0_32_ = ZEXT1632(ZEXT816(0));
    pauVar38 = (undefined1 (*) [32])(uVar34 * 0x20 + (long)local_88);
    if (local_88 == (void *)0x0) {
      pauVar38 = (undefined1 (*) [32])zeros;
    }
    uVar25 = (ulong)(uint)((int)uVar34 >> 0x1f) << 0x20 | uVar34 & 0xffffffff;
    lVar29 = (long)((int)((long)uVar25 % 2) + (int)((long)uVar25 / 2));
    lVar37 = 0;
    for (uVar25 = 0; (long)(uVar25 | 7) < lVar40; uVar25 = uVar25 + 8) {
      auVar42 = *pauVar38;
      lVar30 = local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
               lVar37;
      lVar27 = 0;
      uVar39 = uVar21;
      auVar43 = auVar42;
      auVar44 = auVar42;
      auVar45 = auVar42;
      auVar46 = auVar42;
      auVar47 = auVar42;
      auVar48 = auVar42;
      auVar49 = auVar42;
      while( true ) {
        iVar20 = (int)uVar39;
        uVar39 = (ulong)(iVar20 - 1);
        if (iVar20 == 0) break;
        auVar2 = *(undefined1 (*) [32])
                  ((long)kernel->data + lVar27 + kernel->cstep * lVar29 * kernel->elemsize);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar30);
        auVar5._4_4_ = uVar1;
        auVar5._0_4_ = uVar1;
        auVar5._8_4_ = uVar1;
        auVar5._12_4_ = uVar1;
        auVar5._16_4_ = uVar1;
        auVar5._20_4_ = uVar1;
        auVar5._24_4_ = uVar1;
        auVar5._28_4_ = uVar1;
        auVar42 = vfmadd231ps_avx512vl(auVar42,auVar2,auVar5);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar30 + 4);
        auVar6._4_4_ = uVar1;
        auVar6._0_4_ = uVar1;
        auVar6._8_4_ = uVar1;
        auVar6._12_4_ = uVar1;
        auVar6._16_4_ = uVar1;
        auVar6._20_4_ = uVar1;
        auVar6._24_4_ = uVar1;
        auVar6._28_4_ = uVar1;
        auVar43 = vfmadd231ps_avx512vl(auVar43,auVar2,auVar6);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar30 + 8);
        auVar7._4_4_ = uVar1;
        auVar7._0_4_ = uVar1;
        auVar7._8_4_ = uVar1;
        auVar7._12_4_ = uVar1;
        auVar7._16_4_ = uVar1;
        auVar7._20_4_ = uVar1;
        auVar7._24_4_ = uVar1;
        auVar7._28_4_ = uVar1;
        auVar44 = vfmadd231ps_avx512vl(auVar44,auVar2,auVar7);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar30 + 0xc);
        auVar8._4_4_ = uVar1;
        auVar8._0_4_ = uVar1;
        auVar8._8_4_ = uVar1;
        auVar8._12_4_ = uVar1;
        auVar8._16_4_ = uVar1;
        auVar8._20_4_ = uVar1;
        auVar8._24_4_ = uVar1;
        auVar8._28_4_ = uVar1;
        auVar45 = vfmadd231ps_avx512vl(auVar45,auVar2,auVar8);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar30 + 0x10);
        auVar9._4_4_ = uVar1;
        auVar9._0_4_ = uVar1;
        auVar9._8_4_ = uVar1;
        auVar9._12_4_ = uVar1;
        auVar9._16_4_ = uVar1;
        auVar9._20_4_ = uVar1;
        auVar9._24_4_ = uVar1;
        auVar9._28_4_ = uVar1;
        auVar46 = vfmadd231ps_avx512vl(auVar46,auVar2,auVar9);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar30 + 0x14);
        auVar10._4_4_ = uVar1;
        auVar10._0_4_ = uVar1;
        auVar10._8_4_ = uVar1;
        auVar10._12_4_ = uVar1;
        auVar10._16_4_ = uVar1;
        auVar10._20_4_ = uVar1;
        auVar10._24_4_ = uVar1;
        auVar10._28_4_ = uVar1;
        auVar47 = vfmadd231ps_avx512vl(auVar47,auVar2,auVar10);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar30 + 0x18);
        auVar11._4_4_ = uVar1;
        auVar11._0_4_ = uVar1;
        auVar11._8_4_ = uVar1;
        auVar11._12_4_ = uVar1;
        auVar11._16_4_ = uVar1;
        auVar11._20_4_ = uVar1;
        auVar11._24_4_ = uVar1;
        auVar11._28_4_ = uVar1;
        auVar48 = vfmadd231ps_avx512vl(auVar48,auVar2,auVar11);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar30 + 0x1c);
        auVar12._4_4_ = uVar1;
        auVar12._0_4_ = uVar1;
        auVar12._8_4_ = uVar1;
        auVar12._12_4_ = uVar1;
        auVar12._16_4_ = uVar1;
        auVar12._20_4_ = uVar1;
        auVar12._24_4_ = uVar1;
        auVar12._28_4_ = uVar1;
        auVar49 = vfmadd231ps_avx512vl(auVar49,auVar2,auVar12);
        lVar27 = lVar27 + 0x20;
      }
      *pauVar36 = auVar42;
      pauVar36[1] = auVar43;
      pauVar36[2] = auVar44;
      pauVar36[3] = auVar45;
      pauVar36[4] = auVar46;
      pauVar36[5] = auVar47;
      pauVar36[6] = auVar48;
      pauVar36[7] = auVar49;
      pauVar36 = pauVar36 + 8;
      lVar37 = lVar37 + 1;
    }
    uVar24 = 0;
    for (; (int)((uint)uVar25 | 3) < (int)uVar3; uVar25 = (ulong)((uint)uVar25 + 4)) {
      auVar42 = *pauVar38;
      lVar37 = local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
               (ulong)((uVar24 & 1) + ((uint)(uVar25 >> 3) & 0x1fffffff));
      lVar27 = 0;
      uVar39 = uVar21;
      auVar43 = auVar42;
      auVar44 = auVar42;
      auVar45 = auVar42;
      while( true ) {
        iVar20 = (int)uVar39;
        uVar39 = (ulong)(iVar20 - 1);
        if (iVar20 == 0) break;
        auVar46 = *(undefined1 (*) [32])
                   ((long)kernel->data + lVar27 * 2 + kernel->cstep * lVar29 * kernel->elemsize);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar37);
        auVar47._4_4_ = uVar1;
        auVar47._0_4_ = uVar1;
        auVar47._8_4_ = uVar1;
        auVar47._12_4_ = uVar1;
        auVar47._16_4_ = uVar1;
        auVar47._20_4_ = uVar1;
        auVar47._24_4_ = uVar1;
        auVar47._28_4_ = uVar1;
        auVar42 = vfmadd231ps_avx512vl(auVar42,auVar46,auVar47);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar37 + 4);
        auVar48._4_4_ = uVar1;
        auVar48._0_4_ = uVar1;
        auVar48._8_4_ = uVar1;
        auVar48._12_4_ = uVar1;
        auVar48._16_4_ = uVar1;
        auVar48._20_4_ = uVar1;
        auVar48._24_4_ = uVar1;
        auVar48._28_4_ = uVar1;
        auVar43 = vfmadd231ps_avx512vl(auVar43,auVar46,auVar48);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar37 + 8);
        auVar49._4_4_ = uVar1;
        auVar49._0_4_ = uVar1;
        auVar49._8_4_ = uVar1;
        auVar49._12_4_ = uVar1;
        auVar49._16_4_ = uVar1;
        auVar49._20_4_ = uVar1;
        auVar49._24_4_ = uVar1;
        auVar49._28_4_ = uVar1;
        auVar44 = vfmadd231ps_avx512vl(auVar44,auVar46,auVar49);
        uVar1 = *(undefined4 *)((long)local_e8.data + lVar27 + lVar37 + 0xc);
        auVar2._4_4_ = uVar1;
        auVar2._0_4_ = uVar1;
        auVar2._8_4_ = uVar1;
        auVar2._12_4_ = uVar1;
        auVar2._16_4_ = uVar1;
        auVar2._20_4_ = uVar1;
        auVar2._24_4_ = uVar1;
        auVar2._28_4_ = uVar1;
        auVar45 = vfmadd231ps_avx512vl(auVar45,auVar46,auVar2);
        lVar27 = lVar27 + 0x10;
      }
      *pauVar36 = auVar42;
      pauVar36[1] = auVar43;
      pauVar36[2] = auVar44;
      pauVar36[3] = auVar45;
      pauVar36 = pauVar36 + 4;
      uVar24 = (uint)(byte)((char)uVar24 + 1);
    }
    while( true ) {
      uVar24 = (uint)uVar25;
      if ((int)uVar3 <= (int)uVar24) break;
      pauVar31 = (undefined1 (*) [32])
                 (kernel->cstep * lVar29 * kernel->elemsize + (long)kernel->data);
      auVar50 = ZEXT3264(*pauVar38);
      for (lVar37 = 0; (int)uVar21 != (int)lVar37; lVar37 = lVar37 + 1) {
        uVar1 = *(undefined4 *)
                 ((long)local_e8.data +
                 lVar37 * 4 +
                 local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
                 (ulong)((uVar24 & 3) + ((uint)(uVar25 >> 3) & 0x1fffffff) +
                        (uint)((uVar24 >> 2 & 1) != 0)));
        auVar42._4_4_ = uVar1;
        auVar42._0_4_ = uVar1;
        auVar42._8_4_ = uVar1;
        auVar42._12_4_ = uVar1;
        auVar42._16_4_ = uVar1;
        auVar42._20_4_ = uVar1;
        auVar42._24_4_ = uVar1;
        auVar42._28_4_ = uVar1;
        auVar4 = vfmadd231ps_fma(auVar50._0_32_,auVar42,*pauVar31);
        auVar50 = ZEXT1664(auVar4);
        pauVar31 = pauVar31 + 1;
      }
      *pauVar36 = auVar50._0_32_;
      pauVar36 = pauVar36 + 1;
      uVar25 = (ulong)(uVar24 + 1);
    }
  }
  piVar18 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        free(local_e8.data);
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack16to8_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 64u, 16, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 64u, 16, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 64u, 16, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 64u, 16, opt.workspace_allocator);
    {
        int nn_size = size / 8;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 16;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 16x8
                    __m512 _r0 = _mm512_loadu_ps(img0);
                    __m512 _r1 = _mm512_loadu_ps(img0 + 16);
                    __m512 _r2 = _mm512_loadu_ps(img0 + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(img0 + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(img0 + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(img0 + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(img0 + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(img0 + 16 * 7);

                    __m512 _tmp0 = _mm512_unpacklo_ps(_r0, _r1);
                    __m512 _tmp1 = _mm512_unpackhi_ps(_r0, _r1);
                    __m512 _tmp2 = _mm512_unpacklo_ps(_r2, _r3);
                    __m512 _tmp3 = _mm512_unpackhi_ps(_r2, _r3);
                    __m512 _tmp4 = _mm512_unpacklo_ps(_r4, _r5);
                    __m512 _tmp5 = _mm512_unpackhi_ps(_r4, _r5);
                    __m512 _tmp6 = _mm512_unpacklo_ps(_r6, _r7);
                    __m512 _tmp7 = _mm512_unpackhi_ps(_r6, _r7);

                    __m512 _tmp8 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmp9 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmpa = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmpb = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmpc = _mm512_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmpd = _mm512_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmpe = _mm512_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmpf = _mm512_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));

                    _tmp0 = _mm512_shuffle_f32x4(_tmp8, _tmpc, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp1 = _mm512_shuffle_f32x4(_tmp9, _tmpd, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp2 = _mm512_shuffle_f32x4(_tmpa, _tmpe, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp3 = _mm512_shuffle_f32x4(_tmpb, _tmpf, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp4 = _mm512_shuffle_f32x4(_tmp8, _tmpc, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp5 = _mm512_shuffle_f32x4(_tmp9, _tmpd, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp6 = _mm512_shuffle_f32x4(_tmpa, _tmpe, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp7 = _mm512_shuffle_f32x4(_tmpb, _tmpf, _MM_SHUFFLE(3, 1, 3, 1));

                    _r0 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _r1 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _r2 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                    _r3 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                    _r4 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _r5 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                    _r6 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                    _r7 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_ps(tmpptr, _r0);
                    _mm512_storeu_ps(tmpptr + 16, _r1);
                    _mm512_storeu_ps(tmpptr + 16 * 2, _r2);
                    _mm512_storeu_ps(tmpptr + 16 * 3, _r3);
                    _mm512_storeu_ps(tmpptr + 16 * 4, _r4);
                    _mm512_storeu_ps(tmpptr + 16 * 5, _r5);
                    _mm512_storeu_ps(tmpptr + 16 * 6, _r6);
                    _mm512_storeu_ps(tmpptr + 16 * 7, _r7);

                    img0 += size * 16;
                    tmpptr += 128;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 16;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 16x4
                    __m512 _r0 = _mm512_loadu_ps(img0);
                    __m512 _r1 = _mm512_loadu_ps(img0 + 16);
                    __m512 _r2 = _mm512_loadu_ps(img0 + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(img0 + 16 * 3);

                    __m512 _tmp0 = _mm512_unpacklo_ps(_r0, _r1);
                    __m512 _tmp1 = _mm512_unpackhi_ps(_r0, _r1);
                    __m512 _tmp2 = _mm512_unpacklo_ps(_r2, _r3);
                    __m512 _tmp3 = _mm512_unpackhi_ps(_r2, _r3);

                    __m512 _tmp4 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmp5 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmp6 = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmp7 = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));

                    _tmp0 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp1 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp2 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp3 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));

                    _r0 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _r1 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _r2 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _r3 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_ps(tmpptr, _r0);
                    _mm512_storeu_ps(tmpptr + 16, _r1);
                    _mm512_storeu_ps(tmpptr + 16 * 2, _r2);
                    _mm512_storeu_ps(tmpptr + 16 * 3, _r3);

                    img0 += size * 16;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 16;

                for (int k = 0; k < maxk; k++)
                {
                    __m512 _val = _mm512_load_ps(img0);
                    _mm512_store_ps(tmpptr, _val);

                    img0 += size * 16;
                    tmpptr += 16;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 16;
            }

            _mm256_store_ps(outptr0, _mm512_extractf32x8_ps(_sum0, 0));
            _mm256_store_ps(outptr0 + 8, _mm512_extractf32x8_ps(_sum1, 0));
            _mm256_store_ps(outptr0 + 8 * 2, _mm512_extractf32x8_ps(_sum2, 0));
            _mm256_store_ps(outptr0 + 8 * 3, _mm512_extractf32x8_ps(_sum3, 0));
            _mm256_store_ps(outptr0 + 8 * 4, _mm512_extractf32x8_ps(_sum4, 0));
            _mm256_store_ps(outptr0 + 8 * 5, _mm512_extractf32x8_ps(_sum5, 0));
            _mm256_store_ps(outptr0 + 8 * 6, _mm512_extractf32x8_ps(_sum6, 0));
            _mm256_store_ps(outptr0 + 8 * 7, _mm512_extractf32x8_ps(_sum7, 0));
            _mm256_store_ps(outptr1, _mm512_extractf32x8_ps(_sum0, 1));
            _mm256_store_ps(outptr1 + 8, _mm512_extractf32x8_ps(_sum1, 1));
            _mm256_store_ps(outptr1 + 8 * 2, _mm512_extractf32x8_ps(_sum2, 1));
            _mm256_store_ps(outptr1 + 8 * 3, _mm512_extractf32x8_ps(_sum3, 1));
            _mm256_store_ps(outptr1 + 8 * 4, _mm512_extractf32x8_ps(_sum4, 1));
            _mm256_store_ps(outptr1 + 8 * 5, _mm512_extractf32x8_ps(_sum5, 1));
            _mm256_store_ps(outptr1 + 8 * 6, _mm512_extractf32x8_ps(_sum6, 1));
            _mm256_store_ps(outptr1 + 8 * 7, _mm512_extractf32x8_ps(_sum7, 1));

            outptr0 += 64;
            outptr1 += 64;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 16;
            }

            _mm256_store_ps(outptr0, _mm512_extractf32x8_ps(_sum0, 0));
            _mm256_store_ps(outptr0 + 8, _mm512_extractf32x8_ps(_sum1, 0));
            _mm256_store_ps(outptr0 + 16, _mm512_extractf32x8_ps(_sum2, 0));
            _mm256_store_ps(outptr0 + 24, _mm512_extractf32x8_ps(_sum3, 0));
            _mm256_store_ps(outptr1, _mm512_extractf32x8_ps(_sum0, 1));
            _mm256_store_ps(outptr1 + 8, _mm512_extractf32x8_ps(_sum1, 1));
            _mm256_store_ps(outptr1 + 16, _mm512_extractf32x8_ps(_sum2, 1));
            _mm256_store_ps(outptr1 + 24, _mm512_extractf32x8_ps(_sum3, 1));

            outptr0 += 32;
            outptr1 += 32;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m512 _sum = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);
                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                _sum = _mm512_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 16;
            }

            _mm256_store_ps(outptr0, _mm512_extractf32x8_ps(_sum, 0));
            _mm256_store_ps(outptr1, _mm512_extractf32x8_ps(_sum, 1));

            outptr0 += 8;
            outptr1 += 8;
        }
    }

    remain_outch_start += nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum0 = _mm256_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm256_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm256_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm256_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);

            outptr0 += 64;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum0 = _mm256_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm256_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 16, _sum2);
            _mm256_store_ps(outptr0 + 24, _sum3);

            outptr0 += 32;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                _sum = _mm256_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 8;
            }

            _mm256_store_ps(outptr0, _sum);

            outptr0 += 8;
        }
    }
}